

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

pair<llvm::DenseMapIterator<unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>,_false>,_bool>
* __thiscall
llvm::
DenseMapBase<llvm::SmallDenseMap<unsigned_short,llvm::detail::DenseSetEmpty,4u,llvm::DenseMapInfo<unsigned_short>,llvm::detail::DenseSetPair<unsigned_short>>,unsigned_short,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<unsigned_short>,llvm::detail::DenseSetPair<unsigned_short>>
::try_emplace<llvm::detail::DenseSetEmpty&>
          (pair<llvm::DenseMapIterator<unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>,_false>,_bool>
           *__return_storage_ptr__,
          DenseMapBase<llvm::SmallDenseMap<unsigned_short,llvm::detail::DenseSetEmpty,4u,llvm::DenseMapInfo<unsigned_short>,llvm::detail::DenseSetPair<unsigned_short>>,unsigned_short,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<unsigned_short>,llvm::detail::DenseSetPair<unsigned_short>>
          *this,unsigned_short *Key,DenseSetEmpty *Args)

{
  bool bVar1;
  DenseSetPair<unsigned_short> *pDVar2;
  DenseSetPair<unsigned_short> *E;
  bool local_51;
  iterator local_50;
  bool local_39;
  iterator local_38;
  DenseSetPair<unsigned_short> *local_28;
  DenseSetPair<unsigned_short> *TheBucket;
  DenseSetEmpty *Args_local;
  unsigned_short *Key_local;
  DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
  *this_local;
  
  TheBucket = (DenseSetPair<unsigned_short> *)Args;
  Args_local = (DenseSetEmpty *)Key;
  Key_local = (unsigned_short *)this;
  bVar1 = DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
          ::LookupBucketFor<unsigned_short>
                    ((DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
                      *)this,Key,&local_28);
  if (bVar1) {
    pDVar2 = DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
             ::getBucketsEnd((DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
                              *)this);
    local_38 = DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
               ::makeIterator((DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
                               *)this,local_28,pDVar2,(DebugEpochBase *)this,true);
    local_39 = false;
    std::
    make_pair<llvm::DenseMapIterator<unsigned_short,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<unsigned_short>,llvm::detail::DenseSetPair<unsigned_short>,false>,bool>
              (__return_storage_ptr__,&local_38,&local_39);
  }
  else {
    pDVar2 = InsertIntoBucket<unsigned_short,llvm::detail::DenseSetEmpty&>
                       (this,local_28,(unsigned_short *)Args_local,(DenseSetEmpty *)TheBucket);
    local_28 = pDVar2;
    E = DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
        ::getBucketsEnd((DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
                         *)this);
    local_50 = DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
               ::makeIterator((DenseMapBase<llvm::SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>,_unsigned_short,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
                               *)this,pDVar2,E,(DebugEpochBase *)this,true);
    local_51 = true;
    std::
    make_pair<llvm::DenseMapIterator<unsigned_short,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<unsigned_short>,llvm::detail::DenseSetPair<unsigned_short>,false>,bool>
              (__return_storage_ptr__,&local_50,&local_51);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace(KeyT &&Key, Ts &&... Args) {
    BucketT *TheBucket;
    if (LookupBucketFor(Key, TheBucket))
      return std::make_pair(
               makeIterator(TheBucket, getBucketsEnd(), *this, true),
               false); // Already in map.

    // Otherwise, insert the new element.
    TheBucket =
        InsertIntoBucket(TheBucket, std::move(Key), std::forward<Ts>(Args)...);
    return std::make_pair(
             makeIterator(TheBucket, getBucketsEnd(), *this, true),
             true);
  }